

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_sof(j_compress_ptr cinfo,JPEG_MARKER code)

{
  long lVar1;
  undefined4 in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  undefined8 in_stack_ffffffffffffffe8;
  JPEG_MARKER mark;
  int val;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  mark = (JPEG_MARKER)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  emit_marker((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mark);
  emit_2bytes((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mark);
  if ((0xffff < *(uint *)((long)in_RDI + 0x34)) || (0xffff < *(uint *)(in_RDI + 6))) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x29;
    *(undefined4 *)(*in_RDI + 0x2c) = 0xffff;
    (**(code **)*in_RDI)(in_RDI);
  }
  emit_byte((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mark);
  emit_2bytes((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mark);
  emit_2bytes((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mark);
  emit_byte((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mark);
  lVar1 = in_RDI[0xb];
  for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x4c); iVar2 = iVar2 + 1) {
    val = (int)((ulong)lVar1 >> 0x20);
    emit_byte((j_compress_ptr)CONCAT44(in_ESI,iVar2),val);
    emit_byte((j_compress_ptr)CONCAT44(in_ESI,iVar2),val);
    emit_byte((j_compress_ptr)CONCAT44(in_ESI,iVar2),val);
    lVar1 = lVar1 + 0x60;
  }
  return;
}

Assistant:

LOCAL(void)
emit_sof(j_compress_ptr cinfo, JPEG_MARKER code)
/* Emit a SOF marker */
{
  int ci;
  jpeg_component_info *compptr;

  emit_marker(cinfo, code);

  emit_2bytes(cinfo, 3 * cinfo->num_components + 2 + 5 + 1); /* length */

  /* Make sure image isn't bigger than SOF field can handle */
  if ((long)cinfo->_jpeg_height > 65535L || (long)cinfo->_jpeg_width > 65535L)
    ERREXIT1(cinfo, JERR_IMAGE_TOO_BIG, (unsigned int)65535);

  emit_byte(cinfo, cinfo->data_precision);
  emit_2bytes(cinfo, (int)cinfo->_jpeg_height);
  emit_2bytes(cinfo, (int)cinfo->_jpeg_width);

  emit_byte(cinfo, cinfo->num_components);

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    emit_byte(cinfo, compptr->component_id);
    emit_byte(cinfo, (compptr->h_samp_factor << 4) + compptr->v_samp_factor);
    emit_byte(cinfo, compptr->quant_tbl_no);
  }
}